

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

DynamicStaleResourceWrapper __thiscall
Diligent::DynamicStaleResourceWrapper::
Create<VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities::VulkanHandleTypeId)8>,void>
          (DynamicStaleResourceWrapper *this,
          VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8> *Resource,
          RefCounterType NumReferences)

{
  StaleResourceBase *this_00;
  char (*in_RCX) [19];
  string msg;
  
  if (NumReferences < 1) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"NumReferences >= 1",
               in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/ResourceReleaseQueue.hpp"
               ,0x48);
    std::__cxx11::string::~string((string *)&msg);
  }
  else if (NumReferences == 1) {
    this_00 = (StaleResourceBase *)::operator_new(0x20);
    Create<VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities::
    VulkanHandleTypeId)8>,void>(VulkanUtilities::
    VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities::VulkanHandleTypeId)8>&&,long)::
    SpecificStaleResource::SpecificStaleResource(VulkanUtilities::
    VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities::VulkanHandleTypeId_8>___(this_00,Resource)
    ;
    goto LAB_0023375f;
  }
  this_00 = (StaleResourceBase *)::operator_new(0x28);
  Create<VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities::
  VulkanHandleTypeId)8>,void>(VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities
  ::VulkanHandleTypeId)8>&&,long)::SpecificSharedStaleResource::
  SpecificSharedStaleResource(VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T*,(VulkanUtilities
  ::VulkanHandleTypeId_8>___long_(this_00,Resource,NumReferences);
LAB_0023375f:
  this->m_pStaleResource = this_00;
  return (DynamicStaleResourceWrapper)(StaleResourceBase *)this;
}

Assistant:

static DynamicStaleResourceWrapper Create(ResourceType&& Resource, RefCounterType NumReferences)
    {
        VERIFY_EXPR(NumReferences >= 1);

        class SpecificStaleResource final : public StaleResourceBase
        {
        public:
            SpecificStaleResource(ResourceType&& SpecificResource) :
                m_SpecificResource(std::move(SpecificResource))
            {}

            // clang-format off
            SpecificStaleResource             (const SpecificStaleResource&) = delete;
            SpecificStaleResource             (SpecificStaleResource&&)      = delete;
            SpecificStaleResource& operator = (const SpecificStaleResource&) = delete;
            SpecificStaleResource& operator = (SpecificStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                delete this;
            }

        private:
            ResourceType m_SpecificResource;
        };

        class SpecificSharedStaleResource final : public StaleResourceBase
        {
        public:
            SpecificSharedStaleResource(ResourceType&& SpecificResource, RefCounterType NumReferences) :
                m_SpecificResource(std::move(SpecificResource)),
                m_RefCounter{NumReferences}
            {
            }

            // clang-format off
            SpecificSharedStaleResource             (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource             (SpecificSharedStaleResource&&)      = delete;
            SpecificSharedStaleResource& operator = (const SpecificSharedStaleResource&) = delete;
            SpecificSharedStaleResource& operator = (SpecificSharedStaleResource&&)      = delete;
            // clang-format on

            virtual void Release() override final
            {
                if (m_RefCounter.fetch_add(-1) - 1 == 0)
                {
                    delete this;
                }
            }

        private:
            ResourceType                m_SpecificResource;
            std::atomic<RefCounterType> m_RefCounter;
        };

        return DynamicStaleResourceWrapper{
            NumReferences == 1 ?
                static_cast<StaleResourceBase*>(new SpecificStaleResource{std::move(Resource)}) :
                static_cast<StaleResourceBase*>(new SpecificSharedStaleResource{std::move(Resource), NumReferences})};
    }